

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_3576a8::Db::parseNewExpr(Db *this)

{
  char *pcVar1;
  Node **ppNVar2;
  Node **ppNVar3;
  Node *pNVar4;
  Node *pNVar5;
  short *psVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  NodeArray NVar10;
  Node *Ex;
  Node *local_50;
  Node **local_48;
  size_t local_40;
  size_t local_38;
  
  psVar6 = (short *)this->First;
  pcVar1 = this->Last;
  if ((ulong)((long)pcVar1 - (long)psVar6) < 2) {
    bVar8 = false;
  }
  else {
    bVar8 = *psVar6 == 0x7367;
  }
  if (bVar8 != false) {
    this->First = (char *)(psVar6 + 1);
  }
  psVar6 = (short *)this->First;
  if ((ulong)((long)pcVar1 - (long)psVar6) < 2) {
    bVar9 = false;
  }
  else {
    bVar9 = *(char *)((long)psVar6 + 1) == 'a';
    if (*psVar6 == 0x776e) goto LAB_00194246;
  }
  psVar6 = (short *)this->First;
  if ((ulong)((long)pcVar1 - (long)psVar6) < 2) {
    return (Node *)0x0;
  }
  if (*psVar6 != 0x616e) {
    return (Node *)0x0;
  }
LAB_00194246:
  this->First = (char *)(psVar6 + 1);
  ppNVar2 = (this->Names).Last;
  ppNVar3 = (this->Names).First;
  while ((pcVar1 = this->First, pcVar1 == this->Last || (*pcVar1 != '_'))) {
    local_50 = parseExpr(this);
    if (local_50 == (Node *)0x0) {
      return (Node *)0x0;
    }
    PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_50);
  }
  this->First = pcVar1 + 1;
  NVar10 = popTrailingNodeArray(this,(long)ppNVar2 - (long)ppNVar3 >> 3);
  sVar7 = NVar10.NumElements;
  local_48 = NVar10.Elements;
  pNVar4 = parseType(this);
  if (pNVar4 == (Node *)0x0) {
    return (Node *)0x0;
  }
  psVar6 = (short *)this->First;
  if (((ulong)((long)this->Last - (long)psVar6) < 2) || (*psVar6 != 0x6970)) {
    pcVar1 = this->First;
    if (pcVar1 == this->Last) {
      return (Node *)0x0;
    }
    if (*pcVar1 != 'E') {
      return (Node *)0x0;
    }
    this->First = pcVar1 + 1;
    pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x40);
    pNVar5->K = KExpr;
    pNVar5->RHSComponentCache = No;
    pNVar5->ArrayCache = No;
    pNVar5->FunctionCache = No;
    pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001da0e0;
    pNVar5[1]._vptr_Node = (_func_int **)local_48;
    pNVar5[1].K = (char)sVar7;
    pNVar5[1].RHSComponentCache = (char)(sVar7 >> 8);
    pNVar5[1].ArrayCache = (char)(sVar7 >> 0x10);
    pNVar5[1].FunctionCache = (char)(sVar7 >> 0x18);
    *(int *)&pNVar5[1].field_0xc = (int)(sVar7 >> 0x20);
    pNVar5[2]._vptr_Node = (_func_int **)pNVar4;
    pNVar5[2].K = KNodeArrayNode;
    pNVar5[2].RHSComponentCache = Yes;
    pNVar5[2].ArrayCache = Yes;
    pNVar5[2].FunctionCache = Yes;
    *(undefined4 *)&pNVar5[2].field_0xc = 0;
    pNVar5[3]._vptr_Node = (_func_int **)0x0;
  }
  else {
    this->First = (char *)(psVar6 + 1);
    local_40 = (long)(this->Names).Last - (long)(this->Names).First >> 3;
    local_38 = sVar7;
    while ((pcVar1 = this->First, pcVar1 == this->Last || (*pcVar1 != 'E'))) {
      local_50 = parseExpr(this);
      if (local_50 == (Node *)0x0) {
        return (Node *)0x0;
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_50);
    }
    this->First = pcVar1 + 1;
    NVar10 = popTrailingNodeArray(this,local_40);
    pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x40);
    pNVar5->K = KExpr;
    pNVar5->RHSComponentCache = No;
    pNVar5->ArrayCache = No;
    pNVar5->FunctionCache = No;
    pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001da0e0;
    pNVar5[1]._vptr_Node = (_func_int **)local_48;
    pNVar5[1].K = (undefined1)local_38;
    pNVar5[1].RHSComponentCache = local_38._1_1_;
    pNVar5[1].ArrayCache = local_38._2_1_;
    pNVar5[1].FunctionCache = local_38._3_1_;
    *(undefined4 *)&pNVar5[1].field_0xc = local_38._4_4_;
    pNVar5[2]._vptr_Node = (_func_int **)pNVar4;
    *(NodeArray *)&pNVar5[2].K = NVar10;
  }
  pNVar5[3].K = bVar8;
  pNVar5[3].RHSComponentCache = bVar9;
  return pNVar5;
}

Assistant:

Node *Db::parseNewExpr() {
  bool Global = consumeIf("gs");
  bool IsArray = look(1) == 'a';
  if (!consumeIf("nw") && !consumeIf("na"))
    return nullptr;
  size_t Exprs = Names.size();
  while (!consumeIf('_')) {
    Node *Ex = parseExpr();
    if (Ex == nullptr)
      return nullptr;
    Names.push_back(Ex);
  }
  NodeArray ExprList = popTrailingNodeArray(Exprs);
  Node *Ty = parseType();
  if (Ty == nullptr)
    return Ty;
  if (consumeIf("pi")) {
    size_t InitsBegin = Names.size();
    while (!consumeIf('E')) {
      Node *Init = parseExpr();
      if (Init == nullptr)
        return Init;
      Names.push_back(Init);
    }
    NodeArray Inits = popTrailingNodeArray(InitsBegin);
    return make<NewExpr>(ExprList, Ty, Inits, Global, IsArray);
  } else if (!consumeIf('E'))
    return nullptr;
  return make<NewExpr>(ExprList, Ty, NodeArray(), Global, IsArray);
}